

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  pointer puVar2;
  size_t index;
  size_t index_00;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  short sVar6;
  pointer puVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  AddressingModel AVar14;
  uint uVar15;
  uint uVar16;
  TensorAddressingOperandsMask TVar17;
  int32_t iVar18;
  uint32_t uVar19;
  StorageClass SVar20;
  StorageClass SVar21;
  spv_result_t sVar22;
  Instruction *pIVar23;
  _Tuple_impl<1UL,_bool,_unsigned_int> *p_Var24;
  Instruction *pIVar25;
  Instruction *pIVar26;
  Instruction *this;
  ValidationState_t *pVVar27;
  DiagnosticStream *pDVar28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Tuple_impl<1UL,_bool,_unsigned_int> _Var29;
  ulong uVar30;
  byte bVar31;
  uint32_t uVar32;
  long lVar33;
  byte bVar34;
  char *pcVar35;
  size_t sVar36;
  _Any_data *p_Var37;
  byte bVar38;
  ulong uVar39;
  undefined8 uVar40;
  char *operand_name;
  int iVar41;
  Op opcode;
  tuple<bool,_bool,_unsigned_int> inc_eval;
  uint64_t layout;
  tuple<bool,_bool,_unsigned_int> m_eval;
  char *opcode_name;
  tuple<bool,_bool,_unsigned_int> rc_eval;
  tuple<bool,_bool,_unsigned_int> k_eval;
  string errorVUID;
  tuple<bool,_bool,_unsigned_int> input_interp_eval;
  undefined1 local_2e8 [8];
  _Tuple_impl<1UL,_bool,_unsigned_int> local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  ValidationState_t *local_2c8;
  _Any_data local_2c0;
  undefined1 local_2b0 [16];
  Instruction *local_2a0;
  Instruction *local_298;
  _Tuple_impl<1UL,_bool,_unsigned_int> local_290;
  char *local_288 [2];
  code *local_278 [2];
  uint local_268;
  uint local_264;
  uint local_260;
  uint local_25c;
  tuple<bool,_bool,_unsigned_int> local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  undefined8 local_238;
  undefined8 local_230;
  uint local_224;
  tuple<bool,_bool,_unsigned_int> local_220;
  _Any_data local_218;
  undefined1 local_208 [464];
  tuple<bool,_bool,_unsigned_int> local_38;
  
  uVar3 = *(ushort *)
           ((long)&(inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  opcode = (Op)uVar3;
  if (0x1168 < uVar3) {
    if (uVar3 < 0x14ef) {
      switch(uVar3) {
      case 0x14a9:
      case 0x14ac:
        bVar10 = opcode == OpCooperativeVectorMatrixMulAddNV;
        uVar39 = (ulong)bVar10;
        pcVar35 = "spv::Op::OpCooperativeVectorMatrixMulNV";
        if (bVar10) {
          pcVar35 = "spv::Op::OpCooperativeVectorMatrixMulAddNV";
        }
        sVar36 = uVar39 * 3 + 7;
        index = uVar39 * 3 + 8;
        index_00 = uVar39 * 3 + 9;
        local_2a0 = (Instruction *)(ulong)((uint)bVar10 * 3 + 10);
        local_2c8 = _;
        local_2c0._M_unused._M_object = inst;
        local_288[0] = pcVar35;
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
        local_298 = (Instruction *)CONCAT44(local_298._4_4_,uVar15);
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        local_230 = CONCAT44(local_230._4_4_,uVar15);
        local_268 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
        local_260 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,6);
        local_264 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,9);
        local_240 = sVar36;
        local_25c = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar36);
        local_248 = index;
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index);
        local_238 = CONCAT44(local_238._4_4_,uVar15);
        local_250 = index_00;
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index_00);
        uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(size_t)local_2a0);
        _ = local_2c8;
        sVar22 = anon_unknown_2::ValidateCooperativeVectorPointer(local_2c8,inst,pcVar35,4);
        if (sVar22 != SPV_SUCCESS) {
          return sVar22;
        }
        local_2a0 = (Instruction *)CONCAT44(local_2a0._4_4_,uVar16);
        local_224 = uVar15;
        if ((*(short *)((long)&(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14ac) &&
           (sVar22 = anon_unknown_2::ValidateCooperativeVectorPointer(_,inst,pcVar35,7),
           sVar22 != SPV_SUCCESS)) {
          return sVar22;
        }
        uVar19 = (uint32_t)local_298;
        pIVar23 = ValidationState_t::FindDef(_,(uint32_t)local_298);
        if ((pIVar23->inst_).opcode != 0x14a8) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_288);
          pcVar35 = " result type <id> ";
          lVar33 = 0x12;
          goto LAB_0064226b;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1);
        bVar10 = ValidationState_t::IsIntScalarType(_,uVar15);
        if (((!bVar10) || (uVar19 = ValidationState_t::GetBitWidth(_,uVar15), uVar19 != 0x20)) &&
           ((bVar10 = ValidationState_t::IsFloatScalarType(_,uVar15), !bVar10 ||
            ((uVar19 = ValidationState_t::GetBitWidth(_,uVar15), uVar19 != 0x20 &&
             (uVar19 = ValidationState_t::GetBitWidth(_,uVar15), uVar19 != 0x10)))))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar28," result component type <id> ",0x1c);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
          pcVar35 = " is not a 32 bit int or 16/32 bit float.";
          lVar33 = 0x28;
          goto LAB_0064229e;
        }
        ValidationState_t::EvalInt32IfConst
                  ((tuple<bool,_bool,_unsigned_int> *)&local_290,_,local_25c);
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
        ValidationState_t::EvalInt32IfConst(&local_258,_,uVar15);
        if (((local_290.super__Head_base<1UL,_bool,_false>._M_head_impl != true) ||
            (local_258.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
             super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
             _M_head_impl != true)) ||
           (local_290.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl ==
            local_258.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
            super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)) {
          uVar19 = (uint32_t)local_238;
          ValidationState_t::EvalInt32IfConst(&local_220,_,(uint32_t)local_238);
          pIVar23 = ValidationState_t::FindDef(_,(uint32_t)local_230);
          pIVar23 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
          ValidationState_t::EvalInt32IfConst(&local_38,_,local_268);
          if ((local_38.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
               super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
               _M_head_impl == true) &&
             (((uint)local_38.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                     super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>
                     .super__Head_base<2UL,_unsigned_int,_false>._M_head_impl & 0xfffffffe) !=
              0x3ba247f8)) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_2e8,_,uVar15);
            if ((local_2e8[4] == true) &&
               ((local_220.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                 super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
                 _M_head_impl == true &&
                ((_Head_base<2UL,_unsigned_int,_false>)local_2e8._0_4_ !=
                 local_220.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                 super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)))) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pDVar28 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_288);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28," input number of components ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28," does not match K ",0x12);
              goto LAB_0064307b;
            }
          }
          uVar32 = (uint32_t)local_2a0;
          pIVar23 = ValidationState_t::FindDef(_,(uint32_t)local_2a0);
          bVar10 = ValidationState_t::IsBoolScalarType(_,(pIVar23->inst_).type_id);
          if (!bVar10) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," Transpose <id> ",0x10);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " is not a scalar boolean.";
            lVar33 = 0x19;
            goto LAB_0064229e;
          }
          local_218._M_unused._0_8_ = _;
          local_218._8_8_ = &local_2c0;
          local_208._0_8_ = local_288;
          sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::anon_class_24_3_28eea47e::
                   operator()((anon_class_24_3_28eea47e *)&local_218,local_268,"InputInterpretation"
                             );
          if ((((sVar22 == SPV_SUCCESS) &&
               (sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                         anon_class_24_3_28eea47e::operator()
                                   ((anon_class_24_3_28eea47e *)&local_218,local_260,
                                    "MatrixInterpretation"), sVar22 == SPV_SUCCESS)) &&
              ((opcode != OpCooperativeVectorMatrixMulAddNV ||
               (sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                         anon_class_24_3_28eea47e::operator()
                                   ((anon_class_24_3_28eea47e *)&local_218,local_264,
                                    "BiasInterpretation"), sVar22 == SPV_SUCCESS)))) &&
             (((sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                         anon_class_24_3_28eea47e::operator()
                                   ((anon_class_24_3_28eea47e *)&local_218,local_25c,"M"),
               sVar22 == SPV_SUCCESS &&
               (sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                         anon_class_24_3_28eea47e::operator()
                                   ((anon_class_24_3_28eea47e *)&local_218,uVar19,"K"),
               sVar22 == SPV_SUCCESS)) &&
              (sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                        anon_class_24_3_28eea47e::operator()
                                  ((anon_class_24_3_28eea47e *)&local_218,local_224,"MemoryLayout"),
              sVar22 == SPV_SUCCESS)))) {
            sVar22 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::anon_class_24_3_28eea47e
                     ::operator()((anon_class_24_3_28eea47e *)&local_218,(uint32_t)local_2a0,
                                  "Transpose");
            if (((sVar22 == SPV_SUCCESS) &&
                (sVar22 = anon_unknown_2::ValidateInt32Operand
                                    (_,(Instruction *)local_2c0._M_unused._0_8_,3,local_288[0],
                                     "InputInterpretation"), sVar22 == SPV_SUCCESS)) &&
               ((sVar22 = anon_unknown_2::ValidateInt32Operand
                                    (_,(Instruction *)local_2c0._M_unused._0_8_,6,local_288[0],
                                     "MatrixInterpretation"), sVar22 == SPV_SUCCESS &&
                (((opcode != OpCooperativeVectorMatrixMulAddNV ||
                  (sVar22 = anon_unknown_2::ValidateInt32Operand
                                      (_,(Instruction *)local_2c0._M_unused._0_8_,9,local_288[0],
                                       "BiasInterpretation"), sVar22 == SPV_SUCCESS)) &&
                 ((sVar22 = anon_unknown_2::ValidateInt32Operand
                                      (_,(Instruction *)local_2c0._M_unused._0_8_,
                                       (uint32_t)local_240,local_288[0],"M"), sVar22 == SPV_SUCCESS
                  && (sVar22 = anon_unknown_2::ValidateInt32Operand
                                         (_,(Instruction *)local_2c0._M_unused._0_8_,
                                          (uint32_t)local_248,local_288[0],"K"),
                     sVar22 == SPV_SUCCESS)))))))) {
              operand_name = "MemoryLayout";
              uVar19 = (uint32_t)local_250;
              pcVar35 = local_288[0];
              inst = (Instruction *)local_2c0._M_unused._0_8_;
              goto LAB_006407c5;
            }
          }
          goto joined_r0x006430cb;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28," result type number of components ",0x22);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28," does not match M ",0x12);
LAB_0064307b:
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar28);
LAB_00643083:
        sVar22 = pDVar28->error_;
        goto LAB_006430c4;
      case 0x14aa:
        local_288[0] = "spv::Op::OpCooperativeVectorOuterProductAccumulateNV";
        sVar22 = anon_unknown_2::ValidateCooperativeVectorPointer
                           (_,inst,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",0);
        if (sVar22 != SPV_SUCCESS) {
          return sVar22;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        uVar19 = (pIVar23->inst_).type_id;
        pIVar23 = ValidationState_t::FindDef(_,uVar19);
        if ((pIVar23->inst_).opcode == 0x14a8) {
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
          pIVar25 = ValidationState_t::FindDef(_,uVar15);
          uVar19 = (pIVar25->inst_).type_id;
          pIVar25 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar25->inst_).opcode == 0x14a8) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1);
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
            if (uVar15 == uVar16) {
              sVar22 = anon_unknown_2::ValidateInt32Operand
                                 (_,inst,1,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                                  "Offset");
              if (sVar22 != SPV_SUCCESS) {
                return sVar22;
              }
              sVar22 = anon_unknown_2::ValidateInt32Operand
                                 (_,inst,4,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                                  "MemoryLayout");
              if (sVar22 != SPV_SUCCESS) {
                return sVar22;
              }
              sVar22 = anon_unknown_2::ValidateInt32Operand
                                 (_,inst,5,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                                  "MatrixInterpretation");
              if (sVar22 != SPV_SUCCESS) {
                return sVar22;
              }
              if ((ulong)((long)inst->context_ -
                         *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                   is_sentinel_) < 0x61) goto switchD_0063fba0_caseD_3c;
              sVar22 = anon_unknown_2::ValidateInt32Operand
                                 (_,inst,6,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                                  "MatrixStride");
              goto joined_r0x006430cb;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," A and B component types ",0x19);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar28," and ",5);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2c0,_,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2c0._M_unused._0_8_,local_2c0._8_8_);
            pcVar35 = " do not match.";
            lVar33 = 0xe;
LAB_00642dd6:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar28,pcVar35,lVar33);
            local_208._448_4_ = pDVar28->error_;
LAB_00642de8:
            local_278[0] = (code *)local_2b0._0_8_;
            uVar40 = local_2c0._M_unused._0_8_;
            sVar22 = local_208._448_4_;
            if ((undefined1 *)local_2c0._M_unused._0_8_ != local_2b0) {
LAB_00642df7:
              operator_delete((void *)uVar40,(ulong)(local_278[0] + 1));
            }
            goto LAB_006422b5;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_288);
          pcVar35 = " B type <id> ";
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_288);
          pcVar35 = " A type <id> ";
        }
LAB_00642266:
        lVar33 = 0xd;
LAB_0064226b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar28,pcVar35,lVar33);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " is not a cooperative vector type.";
LAB_00642299:
        lVar33 = 0x22;
LAB_0064229e:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar28,pcVar35,lVar33);
        sVar22 = pDVar28->error_;
        goto LAB_006422b5;
      case 0x14ab:
        local_2c0._M_unused._M_object = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
        sVar22 = anon_unknown_2::ValidateCooperativeVectorPointer
                           (_,inst,"spv::Op::OpCooperativeVectorReduceSumAccumulateNV",0);
        if (sVar22 != SPV_SUCCESS) {
          return sVar22;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        uVar19 = (pIVar23->inst_).type_id;
        pIVar23 = ValidationState_t::FindDef(_,uVar19);
        if ((pIVar23->inst_).opcode != 0x14a8) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_2c0)
          ;
          pcVar35 = " V type <id> ";
          goto LAB_00642266;
        }
        pcVar35 = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
        operand_name = "Offset";
        uVar19 = 1;
LAB_006407c5:
        sVar22 = anon_unknown_2::ValidateInt32Operand(_,inst,uVar19,pcVar35,operand_name);
        goto joined_r0x006430cb;
      case 0x14ad:
      case 0x14ae:
      case 0x14af:
      case 0x14b0:
      case 0x14b1:
      case 0x14b2:
      case 0x14b3:
      case 0x14b4:
      case 0x14b5:
        goto switchD_0063fba0_caseD_3c;
      case 0x14b6:
        pcVar35 = "spv::Op::OpCooperativeVectorLoadNV";
        pIVar23 = (Instruction *)inst;
        break;
      case 0x14b7:
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        pcVar35 = "spv::Op::OpCooperativeVectorStoreNV";
        break;
      default:
        if (opcode - OpCooperativeMatrixLoadKHR < 2) {
          if (opcode == OpCooperativeMatrixLoadKHR) {
            local_288[0] = "spv::Op::OpCooperativeMatrixLoadKHR";
            pIVar23 = (Instruction *)inst;
          }
          else {
            uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
            pIVar23 = ValidationState_t::FindDef(_,uVar15);
            local_288[0] = "spv::Op::OpCooperativeMatrixStoreKHR";
          }
          uVar19 = (pIVar23->inst_).type_id;
          pIVar23 = ValidationState_t::FindDef(_,uVar19);
          sVar6 = *(short *)((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2);
          if ((pIVar23->inst_).opcode != 0x1168) {
            if (sVar6 == 0x1169) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar35 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
LAB_00641498:
              lVar33 = 0x35;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar35 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
              lVar33 = 0x36;
            }
            goto LAB_006414c3;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)inst,(ulong)((uint)(sVar6 == 0x1169) * 2));
          pIVar23 = ValidationState_t::FindDef(_,uVar15);
          if (pIVar23 == (Instruction *)0x0) {
LAB_00641b82:
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            p_Var37 = (_Any_data *)local_288;
LAB_00641ba2:
            pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)p_Var37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," Pointer <id> ",0xe);
LAB_00641bcc:
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " is not a logical pointer.";
            lVar33 = 0x1a;
          }
          else {
            AVar14 = ValidationState_t::addressing_model(_);
            if (AVar14 == AddressingModelLogical) {
              bVar9 = (_->features_).variable_pointers;
              if ((bool)bVar9 == false) {
                iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode);
                if (iVar18 == 0) goto LAB_00641b82;
                bVar9 = (_->features_).variable_pointers;
              }
              if (((bVar9 & 1) != 0) &&
                 (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar23->inst_).opcode),
                 !bVar10)) goto LAB_00641b82;
            }
            uVar19 = (pIVar23->inst_).type_id;
            local_2c8 = (ValidationState_t *)CONCAT44(local_2c8._4_4_,uVar19);
            pIVar25 = ValidationState_t::FindDef(_,uVar19);
            if ((pIVar25 != (Instruction *)0x0) &&
               ((uVar4 = (pIVar25->inst_).opcode, uVar4 == 0x20 || (uVar4 == 0x1141)))) {
              SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
              bVar10 = spvIsVulkanEnv(_->context_->target_env);
              if ((((bVar10) && (SVar21 != StorageClassWorkgroup)) && (SVar21 != StorageBuffer)) &&
                 (SVar21 != PhysicalStorageBuffer)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x230d,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
                pDVar28 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_288);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar28," storage class for pointer type <id> ",0x25);
                uVar32 = (uint32_t)local_2c8;
LAB_00642db6:
                ValidationState_t::getIdName_abi_cxx11_((string *)&local_2c0,_,uVar32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar28,(char *)local_2c0._M_unused._0_8_,local_2c0._8_8_);
                pcVar35 = " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.";
                lVar33 = 0x3b;
                goto LAB_00642dd6;
              }
              if (uVar4 != 0x1141) {
                uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
                pIVar25 = ValidationState_t::FindDef(_,uVar15);
                if ((pIVar25 == (Instruction *)0x0) ||
                   ((bVar10 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), !bVar10 &&
                    (bVar10 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), !bVar10)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  p_Var37 = (_Any_data *)local_288;
                  goto LAB_0064282c;
                }
              }
              uVar15 = Instruction::GetOperandAs<unsigned_int>
                                 ((Instruction *)inst,
                                  (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                         0x1169) | 2);
              pIVar23 = ValidationState_t::FindDef(_,uVar15);
              if (((pIVar23 == (Instruction *)0x0) ||
                  (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar23->inst_).type_id), !bVar10)
                  ) || (iVar18 = spvOpcodeIsConstant((uint)(pIVar23->inst_).opcode), iVar18 == 0)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"MemoryLayout operand <id> ",0x1a);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
                pcVar35 = " must be a 32-bit integer constant instruction.";
                lVar33 = 0x2f;
                goto LAB_00641cd1;
              }
              bVar10 = ValidationState_t::EvalConstantValUint64
                                 (_,uVar15,(uint64_t *)local_2c0._M_pod_data);
              sVar6 = *(short *)((long)&(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 2);
              sVar36 = (ulong)(sVar6 == 0x1169) + 3;
              uVar39 = (long)inst->context_ -
                       *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                 is_sentinel_ >> 4;
              if (sVar36 < uVar39) {
                uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar36);
                pIVar23 = ValidationState_t::FindDef(_,uVar15);
                if ((pIVar23 == (Instruction *)0x0) ||
                   (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar23->inst_).type_id), !bVar10
                   )) goto LAB_0064287d;
                sVar6 = *(short *)((long)&(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2);
                uVar39 = (long)inst->context_ -
                         *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                   is_sentinel_ >> 4;
              }
              else if (bVar10 && local_2c0._M_unused._M_object < 2) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"MemoryLayout ",0xd);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_218);
                pcVar35 = " requires a Stride.";
                lVar33 = 0x13;
                goto LAB_006430b2;
              }
              uVar15 = sVar6 == 0x1169 | 4;
              if ((uVar39 <= uVar15) ||
                 (sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15), sVar22 == SPV_SUCCESS))
              {
                sVar22 = SPV_SUCCESS;
              }
              goto joined_r0x006430cb;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            p_Var37 = (_Any_data *)local_288;
LAB_006418d5:
            pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)p_Var37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," type for pointer <id> ",0x17);
LAB_006418ff:
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " is not a pointer type.";
            lVar33 = 0x17;
          }
          goto LAB_0064229e;
        }
        if (opcode != OpCooperativeMatrixLengthKHR) goto switchD_0063fba0_caseD_3c;
LAB_0064042c:
        pcVar35 = spvOpcodeString(opcode);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218._M_pod_data,pcVar35,(allocator<char> *)&local_2c0);
        p_Var24 = (_Tuple_impl<1UL,_bool,_unsigned_int> *)
                  std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x8f49b8);
        local_2e8 = (undefined1  [8])&local_2d8;
        _Var29 = (_Tuple_impl<1UL,_bool,_unsigned_int>)(p_Var24 + 2);
        if (*p_Var24 == _Var29) {
          local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
          local_2d8._8_8_ = p_Var24[3];
        }
        else {
          local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
          local_2e8 = (undefined1  [8])*p_Var24;
        }
        local_2e0 = p_Var24[1];
        *p_Var24 = _Var29;
        p_Var24[1].super__Tuple_impl<2UL,_unsigned_int> = (_Head_base<2UL,_unsigned_int,_false>)0x0;
        p_Var24[1].super__Head_base<1UL,_bool,_false> = false;
        *(undefined3 *)&p_Var24[1].field_0x5 = 0;
        *(undefined1 *)
         &p_Var24[2].super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>
          ._M_head_impl = 0;
        if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
          operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
        }
        pIVar23 = ValidationState_t::FindDef
                            (_,*(uint32_t *)
                                &(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
        if ((((pIVar23->inst_).opcode != 0x15) ||
            (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1), uVar15 != 0x20)) ||
           (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2), uVar15 != 0))
        goto LAB_00641279;
        sVar6 = *(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2);
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        uVar4 = (pIVar23->inst_).opcode;
        if (sVar6 != 0x116c) {
          if (uVar4 == 0x14ee) goto LAB_00642502;
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2c0,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                     local_2c0._8_8_);
          pcVar35 = " must be OpTypeCooperativeMatrixNV.";
          lVar33 = 0x23;
          goto LAB_006412fc;
        }
        if (uVar4 != 0x1168) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2c0,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                     local_2c0._8_8_);
          pcVar35 = " must be OpTypeCooperativeMatrixKHR.";
          lVar33 = 0x24;
          goto LAB_006412fc;
        }
LAB_00642502:
        sVar22 = SPV_SUCCESS;
        goto LAB_00641332;
      }
      uVar19 = (pIVar23->inst_).type_id;
      pIVar23 = ValidationState_t::FindDef(_,uVar19);
      sVar6 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((pIVar23->inst_).opcode != 0x14a8) {
        if (sVar6 == 0x14b6) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = "spv::Op::OpCooperativeVectorLoadNV Result Type <id> ";
          lVar33 = 0x34;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = "spv::Op::OpCooperativeVectorStoreNV Object type <id> ";
          lVar33 = 0x35;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " is not a cooperative vector type.";
LAB_006414f1:
        lVar33 = 0x22;
        goto LAB_00641cd1;
      }
      sVar22 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,pcVar35,(uint)(sVar6 == 0x14b6) * 2);
      if (sVar22 != SPV_SUCCESS) {
        return sVar22;
      }
      uVar15 = (*(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14b6) + 3;
    }
    else {
      if (0x14f6 < uVar3) {
        if (opcode - OpCooperativeMatrixLoadTensorNV < 2) {
          if (opcode == OpCooperativeMatrixLoadTensorNV) {
            local_288[0] = "spv::Op::OpCooperativeMatrixLoadTensorNV";
            pIVar23 = (Instruction *)inst;
          }
          else {
            uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
            pIVar23 = ValidationState_t::FindDef(_,uVar15);
            local_288[0] = "spv::Op::OpCooperativeMatrixStoreTensorNV";
          }
          uVar19 = (pIVar23->inst_).type_id;
          pIVar23 = ValidationState_t::FindDef(_,uVar19);
          sVar6 = *(short *)((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2);
          if ((pIVar23->inst_).opcode != 0x1168) {
            if (sVar6 == 0x14f7) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar35 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
              lVar33 = 0x3a;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar35 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
              lVar33 = 0x3b;
            }
            goto LAB_006414c3;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)inst,(ulong)((uint)(sVar6 == 0x14f7) * 2));
          pIVar25 = ValidationState_t::FindDef(_,uVar15);
          if (pIVar25 == (Instruction *)0x0) {
LAB_00641ace:
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," Pointer <id> ",0xe);
            goto LAB_00641bcc;
          }
          AVar14 = ValidationState_t::addressing_model(_);
          if (AVar14 == AddressingModelLogical) {
            bVar9 = (_->features_).variable_pointers;
            if ((bool)bVar9 == false) {
              iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar25->inst_).opcode);
              if (iVar18 == 0) goto LAB_00641ace;
              bVar9 = (_->features_).variable_pointers;
            }
            if (((bVar9 & 1) != 0) &&
               (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar25->inst_).opcode),
               !bVar10)) goto LAB_00641ace;
          }
          uVar32 = (pIVar25->inst_).type_id;
          pIVar25 = ValidationState_t::FindDef(_,uVar32);
          if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode != 0x20)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," type for pointer <id> ",0x17);
            goto LAB_006418ff;
          }
          SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
          if (((SVar21 != StorageClassWorkgroup) && (SVar21 != StorageBuffer)) &&
             (SVar21 != PhysicalStorageBuffer)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x230d,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," storage class for pointer type <id> ",0x25);
            goto LAB_00642db6;
          }
          sVar36 = 2;
          if (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
            pIVar25 = ValidationState_t::FindDef(_,uVar15);
            if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).type_id != uVar19)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pDVar28 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_288);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28," Object <id> ",0xd);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
              pcVar35 = " type does not match Result Type.";
              lVar33 = 0x21;
              goto LAB_0064229e;
            }
            sVar36 = (ulong)(*(short *)((long)&(inst->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 2) ==
                            0x14f7) * 2 + 2;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar36);
          pVVar27 = (ValidationState_t *)ValidationState_t::FindDef(_,uVar15);
          if ((pVVar27 == (ValidationState_t *)0x0) ||
             (pIVar25 = ValidationState_t::FindDef
                                  (_,(uint32_t)
                                     (pVVar27->unresolved_forward_ids_)._M_h._M_bucket_count),
             (pIVar25->inst_).opcode != 0x14fa)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," TensorLayout <id> ",0x13);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " does not have a tensor layout type.";
            lVar33 = 0x24;
            goto LAB_0064229e;
          }
          uVar15 = (uint)(*(short *)((long)&(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7
                         ) * 2 + 3;
          if (((ulong)uVar15 <
               (ulong)((long)inst->context_ -
                       *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                 is_sentinel_ >> 4)) &&
             (sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15), sVar22 != SPV_SUCCESS)) {
            return sVar22;
          }
          local_2c8 = pVVar27;
          uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar15);
          iVar41 = ((uVar16 >> 3 & 1) + uVar15 + (uint)((uVar16 >> 4 & 1) != 0)) -
                   (uint)((uVar16 & 2) == 0);
          TVar17 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>
                             ((Instruction *)inst,(ulong)(iVar41 + 2U));
          if ((ulong)((long)inst->context_ -
                      *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                is_sentinel_ >> 4) <
              (ulong)((TVar17 & TensorAddressingOperandsTensorViewMask) +
                      TensorAddressingOperandsTensorViewMask + iVar41 + 2U +
                     (uint)((TVar17 >> 1 & 1) != 0))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," not enough tensor addressing operands.",0x27);
            goto LAB_00643083;
          }
          uVar15 = iVar41 + 3;
          if ((TVar17 & TensorAddressingOperandsTensorViewMask) != MaskNone) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar15);
            pIVar25 = ValidationState_t::FindDef(_,uVar15);
            if ((pIVar25 != (Instruction *)0x0) &&
               (pIVar25 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id),
               (pIVar25->inst_).opcode == 0x14fb)) {
              uVar15 = iVar41 + 4;
              goto LAB_0064338b;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," TensorView <id> ",0x11);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " does not have a tensor view type.";
            goto LAB_00642299;
          }
LAB_0064338b:
          if ((TVar17 & DecodeFunc) == MaskNone) goto switchD_0063fba0_caseD_3c;
          if (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f8) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar35 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
            lVar33 = 0x3d;
            goto LAB_006430b2;
          }
          local_298 = (Instruction *)inst;
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar15);
          local_2a0 = (Instruction *)CONCAT44(local_2a0._4_4_,uVar15);
          pIVar25 = ValidationState_t::FindDef(_,uVar15);
          if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode != 0x36)) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298)
            ;
            pDVar28 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)local_288);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28," DecodeFunc <id> ",0x11);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,(uint32_t)local_2a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " is not a function.";
            lVar33 = 0x13;
          }
          else {
            uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1);
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar25,3);
            pIVar23 = ValidationState_t::FindDef(_,uVar16);
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1);
            if (uVar16 == uVar15) {
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
              pIVar25 = ValidationState_t::FindDef(_,uVar15);
              SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
              if (SVar21 == PhysicalStorageBuffer) {
                pIVar25 = ValidationState_t::FindDef
                                    (_,(uint32_t)
                                       (local_2c8->unresolved_forward_ids_)._M_h._M_bucket_count);
                sVar36 = 3;
                do {
                  uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,sVar36);
                  pIVar26 = ValidationState_t::FindDef(_,uVar15);
                  if ((pIVar26->inst_).opcode != 0x1c) {
LAB_00644387:
                    ValidationState_t::diag
                              ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
                    pDVar28 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)&local_218,(char **)local_288);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar28," DecodeFunc <id> ",0x11);
                    ValidationState_t::getIdName_abi_cxx11_
                              ((string *)local_2e8,_,(uint32_t)local_2a0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar28,
                               " second/third parameter must be array of 32-bit integer with ",0x3d)
                    ;
                    pcVar35 = " dimension equal to the tensor dimension.";
                    lVar33 = 0x29;
                    goto LAB_0064229e;
                  }
                  uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
                  bVar10 = ValidationState_t::EvalConstantValUint64
                                     (_,uVar15,(uint64_t *)local_2c0._M_pod_data);
                  if (bVar10) {
                    uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
                    bVar10 = ValidationState_t::EvalConstantValUint64
                                       (_,uVar15,(uint64_t *)&local_290);
                    if ((bVar10) &&
                       ((_Tuple_impl<1UL,_bool,_unsigned_int>)local_2c0._M_unused._0_8_ != local_290
                       )) goto LAB_00644387;
                  }
                  sVar36 = sVar36 + 1;
                } while (sVar36 != 5);
                goto switchD_0063fba0_caseD_3c;
              }
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
              pDVar28 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_288);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28," DecodeFunc <id> ",0x11);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,(uint32_t)local_2a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
              pcVar35 = " first parameter must be pointer to PhysicalStorageBuffer.";
              lVar33 = 0x3a;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
              pDVar28 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)local_288);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28," DecodeFunc <id> ",0x11);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,(uint32_t)local_2a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
              pcVar35 = " return type must match matrix component type.";
              lVar33 = 0x2e;
            }
          }
          goto LAB_0064229e;
        }
        if (opcode != OpRawAccessChainNV) goto switchD_0063fba0_caseD_3c;
        local_288[0] = (char *)inst;
        pcVar35 = spvOpcodeString(OpRawAccessChainNV);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218._M_pod_data,pcVar35,(allocator<char> *)&local_2c0);
        p_Var24 = (_Tuple_impl<1UL,_bool,_unsigned_int> *)
                  std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x8f49b8);
        _Var29 = (_Tuple_impl<1UL,_bool,_unsigned_int>)(p_Var24 + 2);
        if (*p_Var24 == _Var29) {
          local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
          local_2d8._8_8_ = p_Var24[3];
          local_2e8 = (undefined1  [8])&local_2d8;
        }
        else {
          local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
          local_2e8 = (undefined1  [8])*p_Var24;
        }
        local_2e0 = p_Var24[1];
        *p_Var24 = _Var29;
        p_Var24[1].super__Tuple_impl<2UL,_unsigned_int> = (_Head_base<2UL,_unsigned_int,_false>)0x0;
        p_Var24[1].super__Head_base<1UL,_bool,_false> = false;
        *(undefined3 *)&p_Var24[1].field_0x5 = 0;
        *(undefined1 *)
         &p_Var24[2].super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>
          ._M_head_impl = 0;
        if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
          operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
        }
        pIVar23 = ValidationState_t::FindDef
                            (_,*(uint32_t *)
                                &(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
        if ((pIVar23->inst_).opcode == 0x20) {
          SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
          if (((SVar21 != StorageClassUniform) && (SVar21 != StorageBuffer)) &&
             (SVar21 != PhysicalStorageBuffer)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            pcVar35 = 
            " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
            lVar33 = 0x53;
LAB_00641f43:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
            sVar22 = local_208._448_4_;
            goto LAB_00641f52;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
          pIVar23 = ValidationState_t::FindDef(_,uVar15);
          uVar15 = (uint)(pIVar23->inst_).opcode;
          if ((uVar15 < 0x1f) && ((0x51000000U >> (uVar15 & 0x1f) & 1) != 0)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            pcVar35 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
            lVar33 = 0x3e;
            goto LAB_00641f43;
          }
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
          pIVar23 = ValidationState_t::FindDef(_,uVar15);
          if ((pIVar23->inst_).opcode != 0x2b) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Stride of ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            pcVar35 = " must be OpConstant. Found Op";
            lVar33 = 0x1d;
            goto LAB_00641798;
          }
          pIVar25 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
          if ((pIVar25->inst_).opcode != 0x15) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The type of Stride of ",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," must be OpTypeInt. Found Op",0x1c);
            uVar3 = (pIVar25->inst_).opcode;
            goto LAB_006417a6;
          }
          local_2c0._8_8_ = local_288;
          local_2c0._M_unused._M_object = _;
          local_2b0._0_8_ = local_2e8;
          sVar22 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                             ((anon_class_24_3_e757d3e0 *)&local_2c0,"Index",4);
          if (((sVar22 != SPV_SUCCESS) ||
              (sVar22 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                                  ((anon_class_24_3_e757d3e0 *)&local_2c0,"Offset",5),
              sVar22 != SPV_SUCCESS)) ||
             (sVar22 = SPV_SUCCESS,
             (ulong)(*(long *)(local_288[0] + 0x20) - *(long *)(local_288[0] + 0x18)) < 0x61))
          goto LAB_00641f79;
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_288[0],6);
          if ((uVar15 & 2) != 0) {
            local_290.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                 (_Head_base<2UL,_unsigned_int,_false>)0x0;
            local_290.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
            local_290._5_3_ = 0;
            bVar10 = ValidationState_t::EvalConstantValUint64
                               (_,(pIVar23->inst_).result_id,(uint64_t *)&local_290);
            if ((!bVar10) || (local_290 != (_Tuple_impl<1UL,_bool,_unsigned_int>)0x0))
            goto LAB_00643ce9;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_288[0]);
            pcVar35 = "Stride must not be zero when per-element robustness is used.";
            lVar33 = 0x3c;
LAB_00643f83:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
            sVar22 = local_208._448_4_;
            goto LAB_00641f74;
          }
LAB_00643ce9:
          if ((uVar15 & 1) == 0) {
            sVar22 = SPV_SUCCESS;
            if ((SVar21 == PhysicalStorageBuffer & (byte)((uVar15 & 2) >> 1)) != 0) {
LAB_00643f5a:
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_288[0]);
              pcVar35 = 
              "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
              ;
              lVar33 = 0x57;
              goto LAB_00643f83;
            }
          }
          else {
            sVar22 = SPV_SUCCESS;
            if (SVar21 == PhysicalStorageBuffer) goto LAB_00643f5a;
            if ((uVar15 & 2) != 0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_288[0]);
              pcVar35 = 
              "Per-component robustness and per-element robustness are mutually exclusive.";
              lVar33 = 0x4b;
              goto LAB_00643f83;
            }
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)&local_2c0,_,
                     *(uint32_t *)
                      ((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                     local_2c0._8_8_);
          pcVar35 = " must be OpTypePointer. Found Op";
          lVar33 = 0x20;
LAB_00641798:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
          uVar3 = (pIVar23->inst_).opcode;
LAB_006417a6:
          local_290 = (_Tuple_impl<1UL,_bool,_unsigned_int>)spvOpcodeString((uint)uVar3);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_290)
          ;
          local_258.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
          super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl._0_1_ = 0x2e;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar28,(char *)&local_258,1);
          sVar22 = pDVar28->error_;
LAB_00641f52:
          if ((undefined1 *)local_2c0._M_unused._0_8_ != local_2b0) {
            operator_delete(local_2c0._M_unused._M_object,(ulong)(local_2b0._0_8_ + 1));
          }
LAB_00641f74:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        }
LAB_00641f79:
        if (local_2e8 == (undefined1  [8])&local_2d8) goto joined_r0x006430cb;
        goto LAB_00641f86;
      }
      if (1 < opcode - OpCooperativeMatrixLoadNV) {
        if (opcode == OpCooperativeMatrixLengthNV) goto LAB_0064042c;
        goto switchD_0063fba0_caseD_3c;
      }
      if (opcode == OpCooperativeMatrixLoadNV) {
        local_2c0._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadNV";
        pIVar23 = (Instruction *)inst;
      }
      else {
        uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        local_2c0._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreNV";
      }
      uVar19 = (pIVar23->inst_).type_id;
      pIVar23 = ValidationState_t::FindDef(_,uVar19);
      sVar6 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((pIVar23->inst_).opcode != 0x14ee) {
        if (sVar6 != 0x14ef) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
          goto LAB_00641498;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar35 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
        lVar33 = 0x34;
LAB_006414c3:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " is not a cooperative matrix type.";
        goto LAB_006414f1;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,(ulong)((uint)(sVar6 == 0x14ef) * 2));
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
      if (pIVar23 == (Instruction *)0x0) {
LAB_00641a71:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        p_Var37 = &local_2c0;
        goto LAB_00641ba2;
      }
      AVar14 = ValidationState_t::addressing_model(_);
      if (AVar14 == AddressingModelLogical) {
        bVar9 = (_->features_).variable_pointers;
        if ((bool)bVar9 == false) {
          iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode);
          if (iVar18 == 0) goto LAB_00641a71;
          bVar9 = (_->features_).variable_pointers;
        }
        if (((bVar9 & 1) != 0) &&
           (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar23->inst_).opcode), !bVar10)
           ) goto LAB_00641a71;
      }
      uVar19 = (pIVar23->inst_).type_id;
      pIVar25 = ValidationState_t::FindDef(_,uVar19);
      if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode != 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        p_Var37 = &local_2c0;
        goto LAB_006418d5;
      }
      SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
      if (((SVar21 != StorageClassWorkgroup) && (SVar21 != StorageBuffer)) &&
         (SVar21 != PhysicalStorageBuffer)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28," storage class for pointer type <id> ",0x25);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " is not Workgroup or StorageBuffer.";
        lVar33 = 0x23;
        goto LAB_0064229e;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
      pIVar25 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar25 == (Instruction *)0x0) ||
         ((bVar10 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), !bVar10 &&
          (bVar10 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), !bVar10)))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        p_Var37 = &local_2c0;
LAB_0064282c:
        pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)p_Var37);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar28," Pointer <id> ",0xe);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,(pIVar23->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar28,(char *)local_2e8,(long)local_2e0);
        pcVar35 = "s Type must be a scalar or vector type.";
        lVar33 = 0x27;
        goto LAB_0064229e;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,
                          (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                 0x14ef) | 2);
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar23 == (Instruction *)0x0) ||
         (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar23->inst_).type_id), !bVar10)) {
LAB_0064287d:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Stride operand <id> ",0x14);
        goto LAB_00642ff0;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,
                          (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                 0x14ef) + 3);
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
      if (((pIVar23 == (Instruction *)0x0) ||
          (bVar10 = ValidationState_t::IsBoolScalarType(_,(pIVar23->inst_).type_id), !bVar10)) ||
         ((iVar18 = spvOpcodeIsConstant((uint)(pIVar23->inst_).opcode), iVar18 == 0 &&
          (iVar18 = spvOpcodeIsSpecConstant((uint)(pIVar23->inst_).opcode), iVar18 == 0)))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Column Major operand <id> ",0x1a);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " must be a boolean constant instruction.";
        lVar33 = 0x28;
        goto LAB_00641cd1;
      }
      uVar15 = *(short *)((long)&(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14ef | 4;
    }
    if ((ulong)uVar15 <
        (ulong)((long)inst->context_ -
                *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_
               >> 4)) {
      sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
      goto joined_r0x006430cb;
    }
    goto switchD_0063fba0_caseD_3c;
  }
  switch(uVar3) {
  case 0x3b:
switchD_0063fba0_caseD_3b:
    sVar22 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_0063fba0_caseD_3c;
  case 0x3d:
    pIVar23 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if (pIVar23 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
      uVar19 = *(uint32_t *)
                &(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_006415b3;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar25 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar25 == (Instruction *)0x0) {
LAB_00641e50:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpLoad Pointer <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not a logical pointer.";
      lVar33 = 0x1a;
    }
    else {
      AVar14 = ValidationState_t::addressing_model(_);
      if (AVar14 == AddressingModelLogical) {
        bVar9 = (_->features_).variable_pointers;
        if ((bool)bVar9 == false) {
          iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar25->inst_).opcode);
          if (iVar18 == 0) goto LAB_00641e50;
          bVar9 = (_->features_).variable_pointers;
        }
        if (((bVar9 & 1) != 0) &&
           (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar25->inst_).opcode), !bVar10)
           ) goto LAB_00641e50;
      }
      pIVar26 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
      if (pIVar26 != (Instruction *)0x0) {
        uVar4 = (pIVar26->inst_).opcode;
        if (uVar4 == 0x20) {
          uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
          pIVar26 = ValidationState_t::FindDef(_,uVar16);
          if ((pIVar26 == (Instruction *)0x0) ||
             ((pIVar23->inst_).result_id != (pIVar26->inst_).result_id)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)local_2e8,_,
                       *(uint32_t *)
                        &(inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," does not match Pointer <id> ",0x1d);
            uVar19 = (pIVar25->inst_).result_id;
LAB_00642924:
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2c0,_,uVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"s type.",7);
            goto LAB_00642de8;
          }
        }
        else if (uVar4 != 0x1141) goto LAB_006406ec;
        if ((_->options_->before_hlsl_legalization == false) &&
           (bVar10 = ValidationState_t::ContainsRuntimeArray
                               (_,*(uint32_t *)
                                   &(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), bVar10)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = "Cannot load a runtime-sized array";
          lVar33 = 0x21;
        }
        else {
          sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
          if (sVar22 != SPV_SUCCESS) {
            return sVar22;
          }
          bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if ((((!bVar10) ||
               (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                   (_,*(uint32_t *)
                                       &(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish), !bVar10)) ||
              (uVar3 = (pIVar23->inst_).opcode, uVar3 - 0x15 < 4)) || (uVar3 == 0x20)) {
            ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                      (_,uVar15,(Instruction *)inst,(Instruction *)0x0);
            goto switchD_0063fba0_caseD_3c;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar33 = 0x3a;
        }
        goto LAB_006430b2;
      }
LAB_006406ec:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpLoad type for pointer <id> ",0x1d);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not a pointer type.";
      lVar33 = 0x17;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
    sVar22 = local_208._448_4_;
    goto LAB_006422b5;
  case 0x3e:
    uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar23 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar23 == (Instruction *)0x0) {
LAB_006419da:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not a logical pointer.";
LAB_00641a2f:
      lVar33 = 0x1a;
      goto LAB_00641cd1;
    }
    AVar14 = ValidationState_t::addressing_model(_);
    if (AVar14 == AddressingModelLogical) {
      bVar9 = (_->features_).variable_pointers;
      if ((bool)bVar9 == false) {
        iVar18 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode);
        if (iVar18 == 0) goto LAB_006419da;
        bVar9 = (_->features_).variable_pointers;
      }
      if (((bVar9 & 1) != 0) &&
         (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar23->inst_).opcode), !bVar10))
      goto LAB_006419da;
    }
    pIVar25 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
    if (pIVar25 == (Instruction *)0x0) {
LAB_00641856:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore type for pointer <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not a pointer type.";
      lVar33 = 0x17;
      goto LAB_00641cd1;
    }
    uVar4 = (pIVar25->inst_).opcode;
    if (uVar4 == 0x20) {
      uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
      pIVar26 = ValidationState_t::FindDef(_,uVar16);
      if ((pIVar26 != (Instruction *)0x0) && ((pIVar26->inst_).opcode != 0x13)) goto LAB_0064208c;
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
LAB_00642067:
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = "s type is void.";
      lVar33 = 0xf;
    }
    else {
      if (uVar4 != 0x1141) goto LAB_00641856;
      pIVar26 = (Instruction *)0x0;
LAB_0064208c:
      bVar10 = ValidationState_t::GetPointerTypeInfo
                         (_,(pIVar25->inst_).result_id,
                          (uint32_t *)((_Any_data *)local_288)->_M_pod_data,
                          (StorageClass *)&local_290);
      if (bVar10) {
        if ((9 < (uint)local_290.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl) ||
           ((0x203U >> ((uint)local_290.super__Tuple_impl<2UL,_unsigned_int>.
                              super__Head_base<2UL,_unsigned_int,_false>._M_head_impl & 0x1f) & 1)
            == 0)) {
          if (local_290.super__Tuple_impl<2UL,_unsigned_int>.
              super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 0x14db) {
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_218,_,0x125f,(char *)0x0);
            local_2c8 = (ValidationState_t *)
                        ValidationState_t::function
                                  (_,*(uint32_t *)
                                      &(((inst->dbg_line_insts_).
                                         super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                       _vptr_IntrusiveNodeBase);
            local_2e8 = (undefined1  [8])&local_2d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2e8,local_218._M_unused._M_object,
                       (undefined1 *)(local_218._8_8_ + (long)local_218._M_unused._0_8_));
            local_2c0._8_8_ = (_Any_data *)0x0;
            local_2c0._M_unused._M_object = operator_new(0x20);
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_2c0._M_unused._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_2c0._M_unused._0_8_ + 0x10);
            if (local_2e8 == (undefined1  [8])&local_2d8) {
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_2c0._M_unused._0_8_ + 0x10))->_M_allocated_capacity =
                   local_2d8._M_allocated_capacity;
              p_Var24 = (_Tuple_impl<1UL,_bool,_unsigned_int> *)
                        ((long)local_2c0._M_unused._0_8_ + 0x18);
              p_Var24->super__Tuple_impl<2UL,_unsigned_int> =
                   (_Tuple_impl<2UL,_unsigned_int>)local_2d8._8_4_;
              p_Var24->super__Head_base<1UL,_bool,_false> =
                   (_Head_base<1UL,_bool,_false>)local_2d8._M_local_buf[0xc];
              *(undefined3 *)&p_Var24->field_0x5 = local_2d8._13_3_;
            }
            else {
              *(undefined1 (*) [8])local_2c0._M_unused._0_8_ = local_2e8;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_2c0._M_unused._0_8_ + 0x10))->_M_allocated_capacity =
                   local_2d8._M_allocated_capacity;
            }
            *(_Tuple_impl<1UL,_bool,_unsigned_int> *)((long)local_2c0._M_unused._0_8_ + 8) =
                 local_2e0;
            local_2e0 = (_Tuple_impl<1UL,_bool,_unsigned_int>)0x0;
            local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
            local_2b0._8_8_ =
                 std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1057:15)>
                 ::_M_invoke;
            local_2b0._0_8_ =
                 std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1057:15)>
                 ::_M_manager;
            local_2e8 = (undefined1  [8])&local_2d8;
            Function::RegisterExecutionModelLimitation
                      ((Function *)local_2c8,
                       (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                        *)&local_2c0);
            if ((code *)local_2b0._0_8_ != (code *)0x0) {
              (*(code *)local_2b0._0_8_)(&local_2c0,&local_2c0,3);
            }
            if (local_2e8 != (undefined1  [8])&local_2d8) {
              operator_delete((void *)local_2e8,(ulong)(local_2d8._M_allocated_capacity + 1));
            }
            if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
              operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
            }
          }
          else if (local_290.super__Tuple_impl<2UL,_unsigned_int>.
                   super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 0x14df) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar35 = "ShaderRecordBufferKHR Storage Class variables are read only";
            goto LAB_00642cab;
          }
          bVar10 = spvIsVulkanEnv(_->context_->target_env);
          if (((bVar10) &&
              (local_290.super__Tuple_impl<2UL,_unsigned_int>.
               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 2)) &&
             (pIVar23 = ValidationState_t::TracePointer(_,pIVar23), (pIVar23->inst_).opcode == 0x3b)
             ) {
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar23,0);
            pIVar23 = ValidationState_t::FindDef(_,uVar16);
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
            pIVar23 = ValidationState_t::FindDef(_,uVar16);
            if (((pIVar23->inst_).opcode & 0xfffe) == 0x1c) {
              uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1);
              pIVar23 = ValidationState_t::FindDef(_,uVar16);
            }
            bVar10 = ValidationState_t::HasDecoration(_,(pIVar23->inst_).result_id,Block);
            if (bVar10) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x1b0d,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
              pcVar35 = "In the Vulkan environment, cannot store to Uniform Blocks";
              lVar33 = 0x39;
              goto LAB_00641cd1;
            }
          }
          uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
          pIVar23 = ValidationState_t::FindDef(_,uVar16);
          if ((pIVar23 == (Instruction *)0x0) || (uVar19 = (pIVar23->inst_).type_id, uVar19 == 0)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            pcVar35 = " is not an object.";
            goto LAB_00641ccc;
          }
          pIVar25 = ValidationState_t::FindDef(_,uVar19);
          if ((pIVar25 == (Instruction *)0x0) || (uVar4 = (pIVar25->inst_).opcode, uVar4 == 0x13)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
            uVar15 = uVar16;
            goto LAB_00642067;
          }
          if ((pIVar26 != (Instruction *)0x0) &&
             ((pIVar26->inst_).result_id != (pIVar25->inst_).result_id)) {
            if ((_->options_->relax_struct_store == true) &&
               ((uVar4 == 0x1e && ((pIVar26->inst_).opcode == 0x1e)))) {
              bVar10 = anon_unknown_2::AreLayoutCompatibleStructs
                                 (_,(Instruction *)pIVar26,(Instruction *)pIVar25);
              if (bVar10) goto LAB_006439ac;
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"s layout does not match Object <id> ",
                         0x24);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_288,_,(pIVar23->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,local_288[0],(long)local_288[1]);
              pcVar35 = "s layout.";
              lVar33 = 9;
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,"s type does not match Object <id> ",0x22)
              ;
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_288,_,(pIVar23->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,local_288[0],(long)local_288[1]);
              pcVar35 = "s type.";
              lVar33 = 7;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
            uVar40 = local_288[0];
            sVar22 = local_208._448_4_;
            if ((code **)local_288[0] != local_278) goto LAB_00642df7;
            goto LAB_006422b5;
          }
LAB_006439ac:
          sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
          if (sVar22 != SPV_SUCCESS) {
            return sVar22;
          }
          bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if ((((bVar10) &&
               (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                   (_,*(uint32_t *)
                                       &(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish), bVar10)) &&
              (uVar3 = (pIVar25->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar35 = "8- or 16-bit stores must be a scalar, vector or matrix type";
            goto LAB_00642cab;
          }
          bVar10 = spvIsVulkanEnv(_->context_->target_env);
          if ((bVar10) && (_->options_->before_hlsl_legalization == false)) {
            local_218._M_unused._M_object = (ValidationState_t *)0x0;
            local_218._8_8_ = (char **)0x0;
            local_208._8_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
                 ::_M_invoke;
            local_208._0_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
                 ::_M_manager;
            bVar10 = ValidationState_t::ContainsType
                               (_,(pIVar25->inst_).result_id,
                                (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                                &local_218,true);
            if ((_Any_data *)local_208._0_8_ != (_Any_data *)0x0) {
              (*(code *)local_208._0_8_)(&local_218,&local_218,3);
            }
            if (bVar10) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x1b0c,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
              pcVar35 = 
              "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
              ;
              lVar33 = 0x69;
              goto LAB_00641cd1;
            }
          }
          goto switchD_0063fba0_caseD_3c;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " storage class is read-only";
LAB_006426ff:
        lVar33 = 0x1b;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " is not pointer type";
        lVar33 = 0x14;
      }
    }
LAB_00641cd1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
    sVar22 = local_208._448_4_;
LAB_006422b5:
    if (local_2e8 != (undefined1  [8])&local_2d8) {
      operator_delete((void *)local_2e8,(ulong)(local_2d8._M_allocated_capacity + 1));
    }
LAB_006430c4:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
    break;
  case 0x3f:
  case 0x40:
    uVar19 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar23 = ValidationState_t::FindDef(_,uVar19);
    if (pIVar23 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
LAB_006415b3:
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not defined.";
      lVar33 = 0x10;
      goto LAB_00641cd1;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
    pIVar25 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar25 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar35 = "Source operand <id> ";
      lVar33 = 0x14;
      uVar19 = uVar15;
LAB_00641522:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
      goto LAB_006415b3;
    }
    pIVar23 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
    if ((pIVar23 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar23->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
LAB_00641cb1:
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " is not a pointer.";
LAB_00641ccc:
      lVar33 = 0x12;
      goto LAB_00641cd1;
    }
    local_2a0 = pIVar23;
    pIVar23 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
    if ((pIVar23 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar23->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
      uVar19 = uVar15;
      goto LAB_00641cb1;
    }
    if (*(short *)((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2) != 0x3f) {
      uVar19 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar25 = ValidationState_t::FindDef(_,uVar19);
      if (pIVar25 == (Instruction *)0x0) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar35 = "Size operand <id> ";
        lVar33 = 0x12;
        goto LAB_00641522;
      }
      local_2c8 = (ValidationState_t *)CONCAT44(local_2c8._4_4_,uVar19);
      pIVar26 = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
      bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar26->inst_).result_id);
      if (bVar10) {
        uVar4 = (pIVar25->inst_).opcode;
        uVar19 = (uint32_t)local_2c8;
        if (uVar4 == 0x2b) {
          puVar7 = (pIVar25->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar33 = (long)(pIVar25->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar7;
          if (((pIVar26->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[3] != 1) ||
             (-1 < *(int *)((long)puVar7 + lVar33 + -4))) {
            uVar30 = lVar33 >> 2;
            uVar39 = 3;
            if (uVar30 < 4) {
              uVar30 = 3;
            }
            do {
              if (uVar30 == uVar39) goto LAB_006426aa;
              puVar2 = puVar7 + uVar39;
              uVar39 = uVar39 + 1;
            } while (*puVar2 == 0);
            goto LAB_00643416;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,(uint32_t)local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
          pcVar35 = " cannot have the sign bit set to 1.";
          lVar33 = 0x23;
          goto LAB_00641cd1;
        }
        if (uVar4 != 0x2e) {
LAB_00643416:
          pCVar1 = &_->module_capabilities_;
          bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
          if (bVar10) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)&local_218,_,uVar19);
            uVar40 = local_218._M_unused._0_8_;
            if (((local_218._M_unused._M_member_pointer & 3) != 0 & local_218._M_pod_data[4]) == 1)
            {
              local_2c8 = _;
              local_298 = (Instruction *)inst;
              SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
              local_238 = CONCAT44(extraout_var,SVar21);
              SVar21 = Instruction::GetOperandAs<spv::StorageClass>(local_2a0,1);
              local_230 = CONCAT44(extraout_var_00,SVar21);
              bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
              local_268 = CONCAT31(local_268._1_3_,bVar10);
              bVar10 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
              bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess);
              bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
              bVar12 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
              local_240 = CONCAT71(local_240._1_7_,bVar12);
              bVar12 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
              local_25c = CONCAT31(local_25c._1_3_,bVar12);
              bVar12 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
              local_264 = CONCAT31(local_264._1_3_,bVar10);
              local_248 = CONCAT71(local_248._1_7_,bVar10 || bVar12);
              bVar13 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer16BitAccess)
              ;
              local_250 = CONCAT71(local_250._1_7_,bVar8 || bVar10);
              bVar12 = (bVar13 || bVar12) || (bVar8 || bVar10);
              bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
              bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageInputOutput16);
              local_260 = CONCAT31(local_260._1_3_,bVar8);
              bVar8 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
              bVar9 = 0;
              bVar31 = 0;
              switch((int)local_238) {
              case 1:
              case 3:
                bVar9 = (byte)local_260;
                bVar31 = 0;
                break;
              case 2:
                bVar9 = (byte)local_248;
                bVar31 = (byte)local_264;
                break;
              case 4:
                bVar9 = bVar8;
                bVar31 = (byte)local_240;
                break;
              case 5:
              case 6:
              case 7:
              case 8:
              case 10:
              case 0xb:
                break;
              case 9:
                bVar9 = bVar10 || bVar11;
                bVar31 = bVar11;
                break;
              case 0xc:
                bVar9 = bVar12;
                bVar31 = (byte)local_250;
                break;
              default:
                bVar31 = 0;
              }
              bVar38 = 0;
              bVar34 = 0;
              switch((int)local_230) {
              case 2:
                bVar38 = (byte)local_264;
                bVar34 = (byte)local_248;
                break;
              case 3:
                bVar38 = 0;
                bVar34 = (byte)local_260;
                break;
              case 4:
                bVar38 = (byte)local_240;
                bVar34 = bVar8;
                break;
              case 5:
              case 6:
              case 7:
              case 8:
              case 10:
              case 0xb:
                break;
              case 9:
                bVar38 = bVar11;
                bVar34 = bVar10 || bVar11;
                break;
              case 0xc:
                bVar38 = (byte)local_250;
                bVar34 = bVar12;
                break;
              default:
                bVar38 = 0;
                bVar34 = 0;
              }
              if (((char)local_25c == '\0' && (bVar9 & bVar34) == 0) && (char)local_268 == '\0') {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,local_2c8,SPV_ERROR_INVALID_ID,local_298);
                pcVar35 = "Size must be a multiple of 4";
              }
              else {
                _ = local_2c8;
                inst = (Instruction *)local_298;
                if (((char)local_268 != '\0' || (bVar31 & bVar38) != 0) || (uVar40 & 1) == 0)
                goto LAB_00644122;
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,local_2c8,SPV_ERROR_INVALID_ID,local_298);
                pcVar35 = "Size must be a multiple of 2";
              }
              lVar33 = 0x1c;
              goto LAB_006430b2;
            }
          }
LAB_00644122:
          uVar19 = 3;
          goto LAB_0064412d;
        }
LAB_006426aa:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        pcVar35 = " cannot be a constant zero.";
        goto LAB_006426ff;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      uVar15 = (uint32_t)local_2c8;
LAB_00642ff0:
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " must be a scalar integer type.";
      lVar33 = 0x1f;
      goto LAB_00641cd1;
    }
    if ((local_2a0->inst_).opcode != 0x20) {
      if (uVar4 != 0x20) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar35 = "One of Source or Target must be a typed pointer";
LAB_006430ad:
        lVar33 = 0x2f;
        goto LAB_006430b2;
      }
      pIVar25 = (Instruction *)0x0;
LAB_006432bc:
      uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
      pIVar23 = ValidationState_t::FindDef(_,uVar16);
      if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode == 0x13)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
        goto LAB_00643323;
      }
      if ((pIVar25 == (Instruction *)0x0) ||
         ((pIVar25->inst_).result_id == (pIVar23->inst_).result_id)) goto LAB_006435c0;
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target <id> ",0xc);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"s type does not match Source <id> ",0x22);
      uVar19 = (pIVar23->inst_).result_id;
      goto LAB_00642924;
    }
    uVar16 = Instruction::GetOperandAs<unsigned_int>(local_2a0,2);
    pIVar25 = ValidationState_t::FindDef(_,uVar16);
    if ((pIVar25 == (Instruction *)0x0) || ((pIVar25->inst_).opcode == 0x13)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
      uVar15 = uVar19;
LAB_00643323:
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2e8,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      pcVar35 = " cannot be a void pointer.";
      goto LAB_00641a2f;
    }
    if (uVar4 == 0x20) goto LAB_006432bc;
LAB_006435c0:
    uVar19 = 2;
LAB_0064412d:
    sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar19);
    if (sVar22 != SPV_SUCCESS) {
      return sVar22;
    }
    uVar3 = (((Instruction *)inst)->inst_).opcode;
    if (1 < uVar3 - 0x3f) {
      __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp"
                    ,0x48c,
                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                   );
    }
    uVar15 = uVar3 == 0x3f ^ 3;
    if ((ulong)uVar15 <
        (ulong)((long)(((Instruction *)inst)->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(((Instruction *)inst)->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
      if (sVar22 != SPV_SUCCESS) {
        return sVar22;
      }
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar15);
      uVar15 = (((uVar16 >> 3 & 1) + uVar15 + (uint)((uVar16 >> 4 & 1) != 0)) -
               (uint)((uVar16 & 2) == 0)) + 2;
      if ((ulong)uVar15 <
          (ulong)((long)(((Instruction *)inst)->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(((Instruction *)inst)->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        local_2c8 = _;
        local_298 = (Instruction *)inst;
        if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
          sVar22 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
          inst = (Instruction *)local_298;
          if (sVar22 != SPV_SUCCESS) {
            return sVar22;
          }
          if ((uVar16 & 0x10) == 0) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>(local_298,(ulong)uVar15);
            _ = local_2c8;
            if ((uVar15 & 8) == 0) goto LAB_00644468;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,local_2c8,SPV_ERROR_INVALID_DATA,
                       (Instruction *)inst);
            pcVar35 = "Source memory access must not include MakePointerAvailableKHR";
            lVar33 = 0x3d;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,local_2c8,SPV_ERROR_INVALID_DATA,local_298);
            pcVar35 = "Target memory access must not include MakePointerVisibleKHR";
            lVar33 = 0x3b;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
          sVar22 = local_208._448_4_;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          local_2e8 = (undefined1  [8])spvOpcodeString((uint)(((Instruction *)inst)->inst_).opcode);
          pDVar28 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)local_2e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar28,
                     " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
          sVar22 = pDVar28->error_;
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        _ = local_2c8;
        inst = (Instruction *)local_298;
        if (sVar22 != SPV_SUCCESS) {
          return sVar22;
        }
      }
    }
LAB_00644468:
    pIVar23 = local_2a0;
    if ((local_2a0->inst_).opcode != 0x20) goto switchD_0063fba0_caseD_3c;
    do {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
    } while ((pIVar23->inst_).opcode == 0x20);
    bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((!bVar10) ||
       (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(pIVar23->inst_).result_id),
       !bVar10)) goto switchD_0063fba0_caseD_3c;
    ValidationState_t::diag
              ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    pcVar35 = "Cannot copy memory of objects containing 8- or 16-bit types";
LAB_00642cab:
    lVar33 = 0x3b;
    goto LAB_006430b2;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_0063fba0_caseD_41:
    sVar22 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_0063fba0_caseD_43:
    AVar14 = ValidationState_t::addressing_model(_);
    if (((AVar14 == AddressingModelLogical) &&
        (*(short *)((long)&(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2) == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,
                 "Generating variable pointers requires capability ",0x31);
      pcVar35 = "VariablePointers or VariablePointersStorageBuffer";
      lVar33 = 0x31;
    }
    else {
      sVar22 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar22 != SPV_SUCCESS) {
        return sVar22;
      }
      bVar10 = spvOpcodeGeneratesUntypedPointer
                         ((uint)*(ushort *)
                                 ((long)&(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2));
      uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
      if (bVar10) {
        uVar19 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      }
      else {
        uVar19 = (pIVar23->inst_).type_id;
      }
      pIVar23 = ValidationState_t::FindDef(_,uVar19);
      SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
      pCVar1 = &_->module_capabilities_;
      bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
      if ((!bVar8) ||
         ((((StorageBuffer < SVar21 || ((0x1204U >> (SVar21 & 0x1f) & 1) == 0)) &&
           ((SVar21 != PhysicalStorageBuffer &&
            ((bVar8 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar21 != StorageClassWorkgroup || (!bVar8)))))) ||
          (bVar8 = ValidationState_t::HasDecoration(_,(pIVar23->inst_).result_id,ArrayStride), bVar8
          )))) {
        bVar8 = spvIsVulkanEnv(_->context_->target_env);
        if (bVar8) {
          if (bVar10) {
            bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
          }
          else {
            bVar10 = false;
          }
          if (SVar21 != PhysicalStorageBuffer) {
            if (SVar21 == StorageBuffer) {
              if (bVar10 == false && (_->features_).variable_pointers == false) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x1de4,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
                pcVar35 = 
                "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
                ;
                lVar33 = 0x8b;
                goto LAB_00641cd1;
              }
            }
            else if (SVar21 == StorageClassWorkgroup) {
              bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
              if (bVar10 == false && !bVar8) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x1de3,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
                pcVar35 = 
                "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
                ;
                lVar33 = 0x66;
                goto LAB_00641cd1;
              }
            }
            else if (bVar10 == false) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2e8,_,0x1de2,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
              pcVar35 = 
              "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
              ;
              lVar33 = 0x6c;
              goto LAB_00641cd1;
            }
          }
        }
        goto switchD_0063fba0_caseD_3c;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
      pcVar35 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
      lVar33 = 0x4a;
    }
LAB_006430b2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
    sVar22 = local_208._448_4_;
    goto LAB_006430c4;
  case 0x44:
switchD_0063fba0_caseD_44:
    pcVar35 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218._M_pod_data,pcVar35,(allocator<char> *)&local_2c0);
    p_Var24 = (_Tuple_impl<1UL,_bool,_unsigned_int> *)
              std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x8f49b8);
    local_2e8 = (undefined1  [8])&local_2d8;
    _Var29 = (_Tuple_impl<1UL,_bool,_unsigned_int>)(p_Var24 + 2);
    if (*p_Var24 == _Var29) {
      local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
      local_2d8._8_8_ = p_Var24[3];
    }
    else {
      local_2d8._M_allocated_capacity = *(undefined8 *)_Var29;
      local_2e8 = (undefined1  [8])*p_Var24;
    }
    local_2e0 = p_Var24[1];
    *p_Var24 = _Var29;
    p_Var24[1].super__Tuple_impl<2UL,_unsigned_int> = (_Head_base<2UL,_unsigned_int,_false>)0x0;
    p_Var24[1].super__Head_base<1UL,_bool,_false> = false;
    *(undefined3 *)&p_Var24[1].field_0x5 = 0;
    *(undefined1 *)
     &p_Var24[2].super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
      _M_head_impl = 0;
    if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
      operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
    }
    pIVar23 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if ((((pIVar23->inst_).opcode == 0x15) &&
        (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,1), uVar15 == 0x20)) &&
       (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2), uVar15 == 0)) {
      sVar6 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      uVar19 = ValidationState_t::GetOperandTypeId
                         (_,(Instruction *)inst,(ulong)(sVar6 == 0x1149) | 2);
      pIVar23 = ValidationState_t::FindDef(_,uVar19);
      uVar4 = (pIVar23->inst_).opcode;
      if (sVar6 != 0x1149) {
        if (uVar4 == 0x20) goto LAB_006422de;
LAB_006423e0:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"The Structure\'s type in ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&local_2c0,_,
                   *(uint32_t *)
                    ((long)&(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                   local_2c0._8_8_);
        pcVar35 = " must be a pointer to an OpTypeStruct.";
        lVar33 = 0x26;
        goto LAB_006412fc;
      }
      pIVar23 = (Instruction *)inst;
      if (uVar4 == 0x1141) {
LAB_006422de:
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar23->inst_).opcode == 0x1e) {
          lVar33 = (long)(pIVar23->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar23->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,lVar33 - 1);
          pIVar23 = ValidationState_t::FindDef(_,uVar15);
          if ((pIVar23->inst_).opcode == 0x1d) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>
                               ((Instruction *)inst,(ulong)(sVar6 == 0x1149) + 3);
            sVar22 = SPV_SUCCESS;
            if (lVar33 - 2U == (ulong)uVar15) goto LAB_00641332;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The array member in ",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            pcVar35 = " must be the last member of the struct.";
            lVar33 = 0x27;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Structure\'s last member in ",0x1f);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2c0,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,
                       local_2c0._8_8_);
            pcVar35 = " must be an OpTypeRuntimeArray.";
            lVar33 = 0x1f;
          }
          goto LAB_006412fc;
        }
        goto LAB_006423e0;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Pointer must be an untyped pointer",0x22);
      sVar22 = local_208._448_4_;
    }
    else {
LAB_00641279:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2e8,(long)local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&local_2c0,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2c0._M_unused._0_8_,local_2c0._8_8_)
      ;
      pcVar35 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar33 = 0x32;
LAB_006412fc:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar35,lVar33);
      sVar22 = local_208._448_4_;
      if ((undefined1 *)local_2c0._M_unused._0_8_ != local_2b0) {
        operator_delete(local_2c0._M_unused._M_object,(ulong)(local_2b0._0_8_ + 1));
      }
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
LAB_00641332:
    if (local_2e8 != (undefined1  [8])&local_2d8) {
LAB_00641f86:
      operator_delete((void *)local_2e8,local_2d8._M_allocated_capacity + 1);
    }
    break;
  default:
    switch(opcode) {
    case OpUntypedVariableKHR:
      goto switchD_0063fba0_caseD_3b;
    case OpUntypedAccessChainKHR:
    case OpUntypedInBoundsAccessChainKHR:
      goto switchD_0063fba0_caseD_41;
    case OpSubgroupBallotKHR:
    case OpSubgroupFirstInvocationKHR:
      break;
    case OpUntypedPtrAccessChainKHR:
    case OpUntypedInBoundsPtrAccessChainKHR:
      goto switchD_0063fba0_caseD_43;
    case OpUntypedArrayLengthKHR:
      goto switchD_0063fba0_caseD_44;
    default:
      if (opcode - OpPtrEqual < 3) {
        AVar14 = ValidationState_t::addressing_model(_);
        if ((AVar14 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar35 = 
          "Instruction cannot for logical addressing model be used without a variable pointers capability"
          ;
          lVar33 = 0x5e;
        }
        else {
          pIVar23 = ValidationState_t::FindDef
                              (_,*(uint32_t *)
                                  &(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
          if (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193) {
            if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode != 0x15)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar35 = "Result Type must be an integer scalar";
              lVar33 = 0x25;
            }
            else {
LAB_0064051f:
              uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
              pIVar23 = ValidationState_t::FindDef(_,uVar15);
              uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
              pIVar25 = ValidationState_t::FindDef(_,uVar15);
              pIVar26 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
              this = ValidationState_t::FindDef(_,(pIVar25->inst_).type_id);
              if ((pIVar26 == (Instruction *)0x0) ||
                 ((((uVar4 = (pIVar26->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)) ||
                   (this == (Instruction *)0x0)) ||
                  ((uVar5 = (this->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar35 = "Operand type must be a pointer";
                goto LAB_00641366;
              }
              if ((*(short *)((long)&(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193) ||
                 ((uVar4 != 0x1141 && (uVar5 != 0x1141)))) {
                if ((pIVar23->inst_).type_id != (pIVar25->inst_).type_id) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar35 = "The types of Operand 1 and Operand 2 must match";
                  goto LAB_006430ad;
                }
              }
              else {
                SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
                SVar20 = Instruction::GetOperandAs<spv::StorageClass>(this,1);
                if (SVar21 != SVar20) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar35 = "Pointer storage classes must match";
                  lVar33 = 0x22;
                  goto LAB_006430b2;
                }
              }
              SVar21 = Instruction::GetOperandAs<spv::StorageClass>(pIVar26,1);
              AVar14 = ValidationState_t::addressing_model(_);
              if (AVar14 == AddressingModelLogical) {
                if ((SVar21 & ~Generic) == StorageClassWorkgroup) {
                  if ((SVar21 != StorageClassWorkgroup) ||
                     (bVar10 = EnumSet<spv::Capability>::contains
                                         (&_->module_capabilities_,CapabilityVariablePointers),
                     bVar10)) break;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar35 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar33 = 0x54;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar35 = "Invalid pointer storage class";
                  lVar33 = 0x1d;
                }
              }
              else {
                if (SVar21 != PhysicalStorageBuffer) break;
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar35 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar33 = 0x3f;
              }
            }
          }
          else {
            if ((pIVar23 != (Instruction *)0x0) && ((pIVar23->inst_).opcode == 0x14))
            goto LAB_0064051f;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar35 = "Result Type must be OpTypeBool";
LAB_00641366:
            lVar33 = 0x1e;
          }
        }
        goto LAB_006430b2;
      }
    }
    goto switchD_0063fba0_caseD_3c;
  }
joined_r0x006430cb:
  if (sVar22 == SPV_SUCCESS) {
switchD_0063fba0_caseD_3c:
    sVar22 = SPV_SUCCESS;
  }
  return sVar22;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorLoadNV:
    case spv::Op::OpCooperativeVectorStoreNV:
      if (auto error = ValidateCooperativeVectorLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorOuterProductAccumulateNV:
      if (auto error = ValidateCooperativeVectorOuterProductNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorReduceSumAccumulateNV:
      if (auto error = ValidateCooperativeVectorReduceSumNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorMatrixMulNV:
    case spv::Op::OpCooperativeVectorMatrixMulAddNV:
      if (auto error = ValidateCooperativeVectorMatrixMulNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}